

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  char *__s1;
  
  if (argc < 2) {
    testToFloat();
    testSize();
    testArithmetic();
    testNormalizedConversionError();
    testDenormalizedConversionError();
    testRoundingError();
    testBitPatterns();
    testClassification();
    testLimits();
    testHalfLimits();
    testFunction();
    testVec();
    testColor();
    testShear();
    testMatrix();
    testMiscMatrixAlgo();
    testRoots();
    testFun();
    testInvert();
    testInterval();
    testFrustum();
    testRandom();
    testExtractEuler();
    testExtractSHRT();
    testQuat();
    testQuatSetRotation();
    testQuatSlerp();
    testLineAlgo();
    testBoxAlgo();
    testBox();
    testProcrustes();
    testTinySVD();
    testJacobiEigenSolver();
    testFrustumTest();
    testInterop();
  }
  else {
    __s1 = argv[1];
    iVar1 = strcmp(__s1,"testToFloat");
    if (iVar1 == 0) {
      testToFloat();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testSize");
    if (iVar1 == 0) {
      testSize();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testArithmetic");
    if (iVar1 == 0) {
      testArithmetic();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testNormalizedConversionError");
    if (iVar1 == 0) {
      testNormalizedConversionError();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testDenormalizedConversionError");
    if (iVar1 == 0) {
      testDenormalizedConversionError();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testRoundingError");
    if (iVar1 == 0) {
      testRoundingError();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testBitPatterns");
    if (iVar1 == 0) {
      testBitPatterns();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testClassification");
    if (iVar1 == 0) {
      testClassification();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testLimits");
    if (iVar1 == 0) {
      testLimits();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testHalfLimits");
    if (iVar1 == 0) {
      testHalfLimits();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testFunction");
    if (iVar1 == 0) {
      testFunction();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testVec");
    if (iVar1 == 0) {
      testVec();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testColor");
    if (iVar1 == 0) {
      testColor();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testShear");
    if (iVar1 == 0) {
      testShear();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testMatrix");
    if (iVar1 == 0) {
      testMatrix();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testMiscMatrixAlgo");
    if (iVar1 == 0) {
      testMiscMatrixAlgo();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testRoots");
    if (iVar1 == 0) {
      testRoots();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testFun");
    if (iVar1 == 0) {
      testFun();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testInvert");
    if (iVar1 == 0) {
      testInvert();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testInterval");
    if (iVar1 == 0) {
      testInterval();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testFrustum");
    if (iVar1 == 0) {
      testFrustum();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testRandom");
    if (iVar1 == 0) {
      testRandom();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testExtractEuler");
    if (iVar1 == 0) {
      testExtractEuler();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testExtractSHRT");
    if (iVar1 == 0) {
      testExtractSHRT();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testQuat");
    if (iVar1 == 0) {
      testQuat();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testQuatSetRotation");
    if (iVar1 == 0) {
      testQuatSetRotation();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testQuatSlerp");
    if (iVar1 == 0) {
      testQuatSlerp();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testLineAlgo");
    if (iVar1 == 0) {
      testLineAlgo();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testBoxAlgo");
    if (iVar1 == 0) {
      testBoxAlgo();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testBox");
    if (iVar1 == 0) {
      testBox();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testProcrustes");
    if (iVar1 == 0) {
      testProcrustes();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testTinySVD");
    if (iVar1 == 0) {
      testTinySVD();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testJacobiEigenSolver");
    if (iVar1 == 0) {
      testJacobiEigenSolver();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testFrustumTest");
    if (iVar1 == 0) {
      testFrustumTest();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testInterop");
    if (iVar1 == 0) {
      testInterop();
      __s1 = argv[1];
    }
    iVar1 = strcmp(__s1,"testNoInterop");
    if (iVar1 != 0) {
      return 0;
    }
  }
  testNoInterop();
  return 0;
}

Assistant:

int
main (int argc, char* argv[])
{
    // NB: If you add a test here, make sure to enumerate it in the
    // CMakeLists.txt so it runs as part of the test suite
    TEST (testToFloat);
    TEST (testSize);
    TEST (testArithmetic);
    TEST (testNormalizedConversionError);
    TEST (testDenormalizedConversionError);
    TEST (testRoundingError);
    TEST (testBitPatterns);
    TEST (testClassification);
    TEST (testLimits);
    TEST (testHalfLimits);
    TEST (testFunction);
    TEST (testVec);
    TEST (testColor);
    TEST (testShear);
    TEST (testMatrix);
    TEST (testMiscMatrixAlgo);
    TEST (testRoots);
    TEST (testFun);
    TEST (testInvert);
    TEST (testInterval);
    TEST (testFrustum);
    TEST (testRandom);
    TEST (testExtractEuler);
    TEST (testExtractSHRT);
    TEST (testQuat);
    TEST (testQuatSetRotation);
    TEST (testQuatSlerp);
    TEST (testLineAlgo);
    TEST (testBoxAlgo);
    TEST (testBox);
    TEST (testProcrustes);
    TEST (testTinySVD);
    TEST (testJacobiEigenSolver);
    TEST (testFrustumTest);
    TEST (testInterop);
    TEST (testNoInterop);
    // NB: If you add a test here, make sure to enumerate it in the
    // CMakeLists.txt so it runs as part of the test suite

    return 0;
}